

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O0

int json2map_parse(json2map_t *obj,char *prefix,char *jsonString)

{
  int *__ptr;
  jsmntok_t *in_RDX;
  jsmn_parser *in_RSI;
  char *in_RDI;
  int retVal;
  int count;
  jsmntok_t *token;
  jsmn_parser p;
  undefined8 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint uVar1;
  uint in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (in_RDX == (jsmntok_t *)0x0) {
    iVar2 = -1;
  }
  else {
    jsmn_init((jsmn_parser *)&stack0xffffffffffffffd4);
    strlen((char *)in_RDX);
    iVar2 = jsmn_parse(in_RSI,(char *)in_RDX,
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (jsmntok_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (uint)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
    if (iVar2 < 0) {
      iVar2 = -1;
    }
    else {
      __ptr = (int *)malloc((long)iVar2 << 4);
      uVar1 = 0;
      strlen((char *)in_RDX);
      jsmn_parse(in_RSI,(char *)in_RDX,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                 ,(jsmntok_t *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                 (uint)((ulong)__ptr >> 0x20));
      if ((iVar2 < 1) || (*__ptr != 1)) {
        iVar2 = -1;
      }
      else {
        iVar2 = json2map_parseObject
                          ((json2map_t *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                           (char *)in_RSI,in_RDX,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8
                          );
        free(__ptr);
      }
    }
  }
  return iVar2;
}

Assistant:

int json2map_parse(json2map_t *obj, char *prefix, char *jsonString) {
	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s)... ", jsonString);

	jsmn_parser p;
	jsmntok_t *token;

	if ( jsonString == NULL ) {
		return -1;
	}

	jsmn_init(&p);

	int count = jsmn_parse(&p, jsonString, strlen(jsonString), NULL, 0);
	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s): Count: %d", jsonString, count);
	if ( count < 0 ) {
		DEBUG_TEXT("json2map_parseObject([json2map_t *], %s): ERROR: no object found", jsonString);
		return -1;
	}

	token = (jsmntok_t *) malloc(sizeof(jsmntok_t) * count);
	p.pos = 0;
	jsmn_parse(&p, jsonString, strlen(jsonString), token, count);

	if ( count < 1 || token[0].type != JSMN_OBJECT ) {
		DEBUG_TEXT("json2map_parseObject([json2map_t *], %s): ERROR: first object needs to be a valid object", jsonString);
		return -1;
	}

	DEBUG_TEXT("json2map_parseObject([json2map_t *], %s)... DONE", jsonString);
	int retVal = json2map_parseObject(obj, prefix, jsonString, token, 1, count);
	free(token);
	return retVal;
}